

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O1

void * PololuThread(void *pParam)

{
  int iVar1;
  int iVar2;
  __time_t *p_Var3;
  undefined8 *puVar4;
  timespec *ptVar5;
  int *piVar6;
  long lVar7;
  CRITICAL_SECTION *__mutex;
  long lVar8;
  byte bVar9;
  int value;
  int selectedchannels [24];
  int pws [24];
  int local_124;
  timespec local_120;
  long local_110;
  undefined8 *local_108;
  __time_t *local_100;
  timespec local_f8 [6];
  int local_98 [26];
  
  bVar9 = 0;
  local_124 = 0;
  __mutex = PololuCS;
  lVar7 = 0;
  lVar8 = 0;
  do {
    if (*(void **)((long)addrsPololu + lVar7 * 2) == pParam) {
      valuesPololu[0][0x14] = 0;
      valuesPololu[0][0x15] = 0;
      valuesPololu[0][0x16] = 0;
      valuesPololu[0][0x17] = 0;
      valuesPololu[0][0x10] = 0;
      valuesPololu[0][0x11] = 0;
      valuesPololu[0][0x12] = 0;
      valuesPololu[0][0x13] = 0;
      valuesPololu[0][0xc] = 0;
      valuesPololu[0][0xd] = 0;
      valuesPololu[0][0xe] = 0;
      valuesPololu[0][0xf] = 0;
      valuesPololu[0][8] = 0;
      valuesPololu[0][9] = 0;
      valuesPololu[0][10] = 0;
      valuesPololu[0][0xb] = 0;
      valuesPololu[0][4] = 0;
      valuesPololu[0][5] = 0;
      valuesPololu[0][6] = 0;
      valuesPololu[0][7] = 0;
      valuesPololu[0][0] = 0;
      valuesPololu[0][1] = 0;
      valuesPololu[0][2] = 0;
      valuesPololu[0][3] = 0;
      local_f8[0].tv_sec = (long)*(int *)((long)pParam + 0x5e8) / 1000;
      local_f8[0].tv_nsec = ((long)*(int *)((long)pParam + 0x5e8) % 1000) * 1000000;
      iVar2 = 0;
      nanosleep(local_f8,(timespec *)0x0);
      local_100 = (__time_t *)((long)selectedchannelsPololu[0] + lVar8);
      local_108 = (undefined8 *)((long)pwsPololu[0] + lVar8);
      local_110 = lVar8;
      do {
        pthread_mutex_lock((pthread_mutex_t *)__mutex);
        p_Var3 = local_100;
        ptVar5 = local_f8;
        for (lVar8 = 0xc; lVar8 != 0; lVar8 = lVar8 + -1) {
          ptVar5->tv_sec = *p_Var3;
          p_Var3 = p_Var3 + (ulong)bVar9 * -2 + 1;
          ptVar5 = (timespec *)&ptVar5[-(ulong)bVar9].tv_nsec;
        }
        puVar4 = local_108;
        piVar6 = local_98;
        for (lVar8 = 0xc; lVar8 != 0; lVar8 = lVar8 + -1) {
          *(undefined8 *)piVar6 = *puVar4;
          puVar4 = puVar4 + (ulong)bVar9 * -2 + 1;
          piVar6 = piVar6 + (ulong)bVar9 * -4 + 2;
        }
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        iVar1 = SetAllPWMsPololu((POLOLU *)pParam,(int *)local_f8,local_98);
        if (iVar1 != 0) {
          iVar2 = iVar1;
        }
        local_120.tv_sec = 0;
        local_120.tv_nsec = 10000000;
        nanosleep(&local_120,(timespec *)0x0);
        lVar8 = local_110;
        if (*(int *)((long)pParam + 0x1188) != -1) {
          local_124 = 0;
          iVar1 = GetValuePololu((POLOLU *)pParam,*(int *)((long)pParam + 0x1188),&local_124);
          if (iVar1 != 0) {
            iVar2 = iVar1;
          }
          local_120.tv_sec = 0;
          local_120.tv_nsec = 10000000;
          nanosleep(&local_120,(timespec *)0x0);
          pthread_mutex_lock((pthread_mutex_t *)__mutex);
          lVar8 = local_110;
          *(int *)((long)valuesPololu[0] + local_110 + (long)*(int *)((long)pParam + 0x1188) * 4) =
               local_124;
          *(int *)((long)resPololu + lVar7) = iVar2;
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        }
        if (*(int *)((long)pParam + 0x118c) != -1) {
          local_124 = 0;
          iVar1 = GetValuePololu((POLOLU *)pParam,*(int *)((long)pParam + 0x118c),&local_124);
          if (iVar1 != 0) {
            iVar2 = iVar1;
          }
          local_120.tv_sec = 0;
          local_120.tv_nsec = 10000000;
          nanosleep(&local_120,(timespec *)0x0);
          pthread_mutex_lock((pthread_mutex_t *)__mutex);
          *(int *)((long)valuesPololu[0] + lVar8 + (long)*(int *)((long)pParam + 0x118c) * 4) =
               local_124;
          *(int *)((long)resPololu + lVar7) = iVar2;
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        }
        if (*(int *)((long)pParam + 0x1190) != -1) {
          local_124 = 0;
          iVar1 = GetValuePololu((POLOLU *)pParam,*(int *)((long)pParam + 0x1190),&local_124);
          if (iVar1 != 0) {
            iVar2 = iVar1;
          }
          local_120.tv_sec = 0;
          local_120.tv_nsec = 10000000;
          nanosleep(&local_120,(timespec *)0x0);
          pthread_mutex_lock((pthread_mutex_t *)__mutex);
          *(int *)((long)valuesPololu[0] + lVar8 + (long)*(int *)((long)pParam + 0x1190) * 4) =
               local_124;
          *(int *)((long)resPololu + lVar7) = iVar2;
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        }
        if (*(int *)((long)pParam + 0x1194) != -1) {
          local_124 = 0;
          iVar1 = GetValuePololu((POLOLU *)pParam,*(int *)((long)pParam + 0x1194),&local_124);
          if (iVar1 != 0) {
            iVar2 = iVar1;
          }
          local_120.tv_sec = 0;
          local_120.tv_nsec = 10000000;
          nanosleep(&local_120,(timespec *)0x0);
          pthread_mutex_lock((pthread_mutex_t *)__mutex);
          *(int *)((long)valuesPololu[0] + lVar8 + (long)*(int *)((long)pParam + 0x1194) * 4) =
               local_124;
          *(int *)((long)resPololu + lVar7) = iVar2;
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        }
        if (*(int *)((long)pParam + 0x1198) != -1) {
          local_124 = 0;
          iVar1 = GetValuePololu((POLOLU *)pParam,*(int *)((long)pParam + 0x1198),&local_124);
          if (iVar1 != 0) {
            iVar2 = iVar1;
          }
          local_120.tv_sec = 0;
          local_120.tv_nsec = 10000000;
          nanosleep(&local_120,(timespec *)0x0);
          pthread_mutex_lock((pthread_mutex_t *)__mutex);
          *(int *)((long)valuesPololu[0] + lVar8 + (long)*(int *)((long)pParam + 0x1198) * 4) =
               local_124;
          *(int *)((long)resPololu + lVar7) = iVar2;
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        }
        if (*(int *)((long)pParam + 0x119c) != -1) {
          local_124 = 0;
          iVar1 = GetValuePololu((POLOLU *)pParam,*(int *)((long)pParam + 0x119c),&local_124);
          if (iVar1 != 0) {
            iVar2 = iVar1;
          }
          local_120.tv_sec = 0;
          local_120.tv_nsec = 10000000;
          nanosleep(&local_120,(timespec *)0x0);
          pthread_mutex_lock((pthread_mutex_t *)__mutex);
          *(int *)((long)valuesPololu[0] + lVar8 + (long)*(int *)((long)pParam + 0x119c) * 4) =
               local_124;
          *(int *)((long)resPololu + lVar7) = iVar2;
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        }
        if (*(int *)((long)pParam + 0x11a0) != -1) {
          local_124 = 0;
          iVar1 = GetValuePololu((POLOLU *)pParam,*(int *)((long)pParam + 0x11a0),&local_124);
          if (iVar1 != 0) {
            iVar2 = iVar1;
          }
          local_120.tv_sec = 0;
          local_120.tv_nsec = 10000000;
          nanosleep(&local_120,(timespec *)0x0);
          pthread_mutex_lock((pthread_mutex_t *)__mutex);
          *(int *)((long)valuesPololu[0] + lVar8 + (long)*(int *)((long)pParam + 0x11a0) * 4) =
               local_124;
          *(int *)((long)resPololu + lVar7) = iVar2;
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        }
        pthread_mutex_lock((pthread_mutex_t *)__mutex);
        *(int *)((long)resPololu + lVar7) = iVar2;
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      } while (*(int *)((long)bExitPololu + lVar7) == 0);
      return (void *)0x0;
    }
    lVar8 = lVar8 + 0x60;
    __mutex = __mutex + 1;
    lVar7 = lVar7 + 4;
  } while (lVar8 != 0x600);
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE PololuThread(void* pParam)
{
	POLOLU* pPololu = (POLOLU*)pParam;
	int id = 0, res = EXIT_FAILURE, err = EXIT_SUCCESS;
	int selectedchannels[NB_CHANNELS_PWM_POLOLU];
	int pws[NB_CHANNELS_PWM_POLOLU];
	int value = 0;

	while (addrsPololu[id] != pPololu)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return 0;
	}

	memset(valuesPololu, 0, NB_CHANNELS_POLOLU*sizeof(int));
	
	mSleep(pPololu->threadperiod);

	for (;;)
	{
		EnterCriticalSection(&PololuCS[id]);
		memcpy(selectedchannels, selectedchannelsPololu[id], NB_CHANNELS_PWM_POLOLU*sizeof(int));
		memcpy(pws, pwsPololu[id], NB_CHANNELS_PWM_POLOLU*sizeof(int));
		LeaveCriticalSection(&PololuCS[id]);
		res = SetAllPWMsPololu(pPololu, selectedchannels, pws);
		if (res != EXIT_SUCCESS) err = res;
		mSleep(10);
		if (pPololu->winddiranaloginputchan != -1)
		{
			value = 0;
			res = GetValuePololu(pPololu, pPololu->winddiranaloginputchan, &value);
			if (res != EXIT_SUCCESS) err = res;
			mSleep(10);
			EnterCriticalSection(&PololuCS[id]);
			valuesPololu[id][pPololu->winddiranaloginputchan] = value;
			resPololu[id] = err;
			LeaveCriticalSection(&PololuCS[id]);
		}
		//else mSleep(10);
		if (pPololu->windspeedanaloginputchan != -1)
		{
			value = 0;
			res = GetValuePololu(pPololu, pPololu->windspeedanaloginputchan, &value);
			if (res != EXIT_SUCCESS) err = res;
			mSleep(10);
			EnterCriticalSection(&PololuCS[id]);
			valuesPololu[id][pPololu->windspeedanaloginputchan] = value;
			resPololu[id] = err;
			LeaveCriticalSection(&PololuCS[id]);
		}
		//else mSleep(10);
		if (pPololu->vbat1analoginputchan != -1)
		{
			value = 0;
			res = GetValuePololu(pPololu, pPololu->vbat1analoginputchan, &value);
			if (res != EXIT_SUCCESS) err = res;
			mSleep(10);
			EnterCriticalSection(&PololuCS[id]);
			valuesPololu[id][pPololu->vbat1analoginputchan] = value;
			resPololu[id] = err;
			LeaveCriticalSection(&PololuCS[id]);
		}
		//else mSleep(10);
		if (pPololu->ibat1analoginputchan != -1)
		{
			value = 0;
			res = GetValuePololu(pPololu, pPololu->ibat1analoginputchan, &value);
			if (res != EXIT_SUCCESS) err = res;
			mSleep(10);
			EnterCriticalSection(&PololuCS[id]);
			valuesPololu[id][pPololu->ibat1analoginputchan] = value;
			resPololu[id] = err;
			LeaveCriticalSection(&PololuCS[id]);
		}
		//else mSleep(10);
		if (pPololu->vbat2analoginputchan != -1)
		{
			value = 0;
			res = GetValuePololu(pPololu, pPololu->vbat2analoginputchan, &value);
			if (res != EXIT_SUCCESS) err = res;
			mSleep(10);
			EnterCriticalSection(&PololuCS[id]);
			valuesPololu[id][pPololu->vbat2analoginputchan] = value;
			resPololu[id] = err;
			LeaveCriticalSection(&PololuCS[id]);
		}
		//else mSleep(10);
		if (pPololu->ibat2analoginputchan != -1)
		{
			value = 0;
			res = GetValuePololu(pPololu, pPololu->ibat2analoginputchan, &value);
			if (res != EXIT_SUCCESS) err = res;
			mSleep(10);
			EnterCriticalSection(&PololuCS[id]);
			valuesPololu[id][pPololu->ibat2analoginputchan] = value;
			resPololu[id] = err;
			LeaveCriticalSection(&PololuCS[id]);
		}
		//else mSleep(10);
		if (pPololu->switchanaloginputchan != -1)
		{
			value = 0;
			res = GetValuePololu(pPololu, pPololu->switchanaloginputchan, &value);
			if (res != EXIT_SUCCESS) err = res;
			mSleep(10);
			EnterCriticalSection(&PololuCS[id]);
			valuesPololu[id][pPololu->switchanaloginputchan] = value;
			resPololu[id] = err;
			LeaveCriticalSection(&PololuCS[id]);
		}
		//else mSleep(10);
		EnterCriticalSection(&PololuCS[id]);
		resPololu[id] = err;
		LeaveCriticalSection(&PololuCS[id]);
		if (bExitPololu[id]) break;
	}

	return 0;
}